

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

void __thiscall duckdb::CSVErrorHandler::ThrowError(CSVErrorHandler *this,CSVError *csv_error)

{
  CSVErrorType CVar1;
  pointer pcVar2;
  pointer pCVar3;
  CSVError *pCVar4;
  bool bVar5;
  ulong uVar6;
  idx_t iVar7;
  ostream *poVar8;
  undefined1 **ppuVar9;
  ConversionException *this_00;
  LinesPerBoundary *error_info;
  pointer pCVar10;
  CSVError error_to_throw;
  ostringstream error;
  string local_260;
  CSVError *local_240;
  undefined1 *local_238;
  long local_230;
  undefined1 local_228 [16];
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  idx_t local_1f8;
  idx_t iStack_1f0;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  LinesPerBoundary local_1c8;
  idx_t local_1b8;
  idx_t iStack_1b0;
  ostringstream local_1a8 [376];
  
  local_238 = local_228;
  pcVar2 = (csv_error->error_message)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar2,pcVar2 + (csv_error->error_message)._M_string_length);
  local_218 = local_208;
  pcVar2 = (csv_error->full_error_message)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar2,pcVar2 + (csv_error->full_error_message)._M_string_length);
  local_1f8 = *(idx_t *)&csv_error->type;
  iStack_1f0 = csv_error->column_idx;
  local_1e8 = local_1d8;
  pcVar2 = (csv_error->csv_row)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + (csv_error->csv_row)._M_string_length);
  local_1c8.boundary_idx = (csv_error->error_info).boundary_idx;
  local_1c8.lines_in_batch = (csv_error->error_info).lines_in_batch;
  local_1b8 = csv_error->row_byte_position;
  iStack_1b0 = (csv_error->byte_position).index;
  uVar6 = GetLineInternal(this,&local_1c8);
  local_240 = csv_error;
  if (((this->print_line == true) && ((byte)local_1f8 < 9)) &&
     ((0x1ddU >> ((byte)local_1f8 & 0x1f) & 1) != 0)) {
    pCVar10 = (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
              super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar3 = (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
             super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar10 != pCVar3) {
      error_info = &pCVar10->error_info;
      do {
        bVar5 = CanGetLine(this,error_info->boundary_idx);
        if (bVar5) {
          iVar7 = GetLineInternal(this,error_info);
          if (iVar7 < uVar6) {
            ::std::__cxx11::string::_M_assign((string *)&local_238);
            ::std::__cxx11::string::_M_assign((string *)&local_218);
            local_1f8 = error_info[-3].boundary_idx;
            iStack_1f0 = error_info[-3].lines_in_batch;
            ::std::__cxx11::string::_M_assign((string *)&local_1e8);
            local_1c8.boundary_idx = error_info->boundary_idx;
            local_1c8.lines_in_batch = error_info->lines_in_batch;
            local_1b8 = error_info[1].boundary_idx;
            iStack_1b0 = error_info[1].lines_in_batch;
            uVar6 = iVar7;
          }
        }
        pCVar10 = (pointer)(error_info + 2);
        error_info = error_info + 9;
      } while (pCVar10 != pCVar3);
    }
  }
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  pCVar4 = local_240;
  if (((this->print_line == true) && ((byte)local_1f8 < 9)) &&
     ((0x1ddU >> ((byte)local_1f8 & 0x1f) & 1) != 0)) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"CSV Error on Line: ",0x13);
    poVar8 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    local_260._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_260,1);
    if (local_1e0 != 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Original Line: ",0xf);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1e8,local_1e0);
      local_260._M_dataplus._M_p._0_1_ = 10;
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_260,1);
    }
  }
  ppuVar9 = &local_218;
  if (local_210 == 0) {
    ppuVar9 = &local_238;
  }
  if (local_210 == 0) {
    local_210 = local_230;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,*ppuVar9,local_210);
  CVar1 = pCVar4->type;
  this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
  if (CVar1 == NULLPADDED_QUOTED_NEW_VALUE) {
    ::std::__cxx11::stringbuf::str();
    ParameterNotAllowedException::ParameterNotAllowedException
              ((ParameterNotAllowedException *)this_00,&local_260);
    __cxa_throw(this_00,&ParameterNotAllowedException::typeinfo,::std::runtime_error::~runtime_error
               );
  }
  if (CVar1 == COLUMN_NAME_TYPE_MISMATCH) {
    ::std::__cxx11::stringbuf::str();
    BinderException::BinderException((BinderException *)this_00,&local_260);
    __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (CVar1 == CAST_ERROR) {
    ::std::__cxx11::stringbuf::str();
    ConversionException::ConversionException(this_00,&local_260);
    __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::stringbuf::str();
  InvalidInputException::InvalidInputException((InvalidInputException *)this_00,&local_260);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVErrorHandler::ThrowError(const CSVError &csv_error) {
	auto error_to_throw = csv_error;
	idx_t error_to_throw_row = GetLineInternal(error_to_throw.error_info);
	if (PrintLineNumber(error_to_throw) && !errors.empty()) {
		// We stored a previous error here, we pick the one that happens the earliest to throw
		for (const auto &error : errors) {
			if (CanGetLine(error.GetBoundaryIndex())) {
				idx_t cur_error_to_throw = GetLineInternal(error.error_info);
				if (cur_error_to_throw < error_to_throw_row) {
					error_to_throw = error;
					error_to_throw_row = cur_error_to_throw;
				}
			}
		}
	}
	std::ostringstream error;
	if (PrintLineNumber(error_to_throw)) {
		error << "CSV Error on Line: " << error_to_throw_row << '\n';
		if (!error_to_throw.csv_row.empty()) {
			error << "Original Line: " << error_to_throw.csv_row << '\n';
		}
	}
	if (error_to_throw.full_error_message.empty()) {
		error << error_to_throw.error_message;
	} else {
		error << error_to_throw.full_error_message;
	}
	switch (csv_error.type) {
	case CAST_ERROR:
		throw ConversionException(error.str());
	case COLUMN_NAME_TYPE_MISMATCH:
		throw BinderException(error.str());
	case NULLPADDED_QUOTED_NEW_VALUE:
		throw ParameterNotAllowedException(error.str());
	default:
		throw InvalidInputException(error.str());
	}
}